

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_features.c
# Opt level: O0

_Bool allow_512bit_vectors(u32 *manufacturer,u32 family,u32 model)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  _Bool local_1;
  
  iVar1 = memcmp(in_RDI,"GenuineIntel",0xc);
  if (iVar1 == 0) {
    if (in_ESI == 6) {
      if ((((in_EDX == 0x55) || (in_EDX == 0x6a)) || (in_EDX == 0x6c)) ||
         ((in_EDX == 0x7e || (in_EDX == 0x8c || in_EDX == 0x8d)))) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static inline bool
allow_512bit_vectors(const u32 manufacturer[3], u32 family, u32 model)
{
#ifdef TEST_SUPPORT__DO_NOT_USE
	return true;
#endif
	if (memcmp(manufacturer, "GenuineIntel", 12) != 0)
		return true;
	if (family != 6)
		return true;
	switch (model) {
	case 85: /* Skylake (Server), Cascade Lake, Cooper Lake */
	case 106: /* Ice Lake (Server) */
	case 108: /* Ice Lake (Server) */
	case 126: /* Ice Lake (Client) */
	case 140: /* Tiger Lake */
	case 141: /* Tiger Lake */
		return false;
	}
	return true;
}